

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O0

UniquePtr<SSL_CTX> __thiscall
bssl::anon_unknown_0::SSLVersionTest::CreateContext(SSLVersionTest *this)

{
  bool bVar1;
  uint16_t uVar2;
  int iVar3;
  pointer psVar4;
  SSLVersionTest *in_RSI;
  _Head_base<0UL,_ssl_ctx_st_*,_false> local_58;
  unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> local_28;
  UniquePtr<SSL_CTX> ctx;
  SSL_METHOD *method;
  SSLVersionTest *this_local;
  
  bVar1 = is_dtls(in_RSI);
  if (bVar1) {
    local_58._M_head_impl = (ssl_ctx_st *)DTLS_method();
  }
  else {
    local_58._M_head_impl = (ssl_ctx_st *)TLS_method();
  }
  ctx._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl =
       (__uniq_ptr_data<ssl_ctx_st,_bssl::internal::Deleter,_true,_true>)
       (__uniq_ptr_data<ssl_ctx_st,_bssl::internal::Deleter,_true,_true>)local_58._M_head_impl;
  psVar4 = (pointer)SSL_CTX_new((SSL_METHOD *)local_58._M_head_impl);
  std::unique_ptr<ssl_ctx_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<ssl_ctx_st,bssl::internal::Deleter> *)&local_28,psVar4);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_28);
  if (bVar1) {
    psVar4 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get(&local_28);
    uVar2 = version(in_RSI);
    iVar3 = SSL_CTX_set_min_proto_version(psVar4,uVar2);
    if (iVar3 != 0) {
      psVar4 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get(&local_28);
      uVar2 = version(in_RSI);
      iVar3 = SSL_CTX_set_max_proto_version(psVar4,uVar2);
      if (iVar3 != 0) {
        std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::unique_ptr
                  ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)this,&local_28);
        goto LAB_0019c264;
      }
    }
  }
  std::unique_ptr<ssl_ctx_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<ssl_ctx_st,bssl::internal::Deleter> *)this,(nullptr_t)0x0);
LAB_0019c264:
  std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::~unique_ptr(&local_28);
  return (__uniq_ptr_data<ssl_ctx_st,_bssl::internal::Deleter,_true,_true>)
         (__uniq_ptr_data<ssl_ctx_st,_bssl::internal::Deleter,_true,_true>)this;
}

Assistant:

bssl::UniquePtr<SSL_CTX> CreateContext() const {
    const SSL_METHOD *method = is_dtls() ? DTLS_method() : TLS_method();
    bssl::UniquePtr<SSL_CTX> ctx(SSL_CTX_new(method));
    if (!ctx || !SSL_CTX_set_min_proto_version(ctx.get(), version()) ||
        !SSL_CTX_set_max_proto_version(ctx.get(), version())) {
      return nullptr;
    }
    return ctx;
  }